

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O2

void ParseExtDeviceDesc(EeePExtI2CDeviceDesc_t *dblock)

{
  char *pcVar1;
  
  puts("   Extension EEPROM Device:");
  printf("      Bus: %s, Device Address: %x\n",buses_str[dblock->DeviceBus],
         (ulong)(ushort)(*(ushort *)dblock->DeviceAddr << 8 | *(ushort *)dblock->DeviceAddr >> 8));
  pcVar1 = "Extended";
  if ((dblock->DeviceDesc & 0x10) == 0) {
    pcVar1 = "Standard";
  }
  printf("      Size: %d bytes, Index: %s\n",(ulong)(uint)(0x100 << (dblock->DeviceDesc & 0xf)),
         pcVar1);
  return;
}

Assistant:

void ParseExtDeviceDesc(EeePExtI2CDeviceDesc_t *dblock)
{
	printf("   Extension EEPROM Device:\n");
	printf("      Bus: %s, Device Address: %x\n", buses_str[dblock->DeviceBus], 
		(unsigned)dblock->DeviceAddr[0] << 8 | (unsigned)dblock->DeviceAddr[1]);
	printf("      Size: %d bytes, Index: %s\n", 256 << (dblock->DeviceDesc & 0xF), 
		dblock->DeviceDesc & 0x10 ? "Extended" : "Standard");
}